

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O3

int rd_pick_intra_angle_sbuv
              (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,int rate_overhead,int64_t best_rd,
              int *rate,RD_STATS *rd_stats)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  int64_t iVar5;
  ulong uVar6;
  bool bVar7;
  int best_angle_delta;
  int local_bc;
  int64_t best_rd_local;
  MB_MODE_INFO *local_b0;
  AV1_COMP *local_a8;
  int *local_a0;
  ulong local_98;
  long local_90;
  int64_t rd_cost [10];
  
  local_b0 = *(x->e_mbd).mi;
  best_angle_delta = 0;
  rd_stats->rate = 0x7fffffff;
  rd_stats->skip_txfm = '\0';
  rd_stats->dist = 0x7fffffffffffffff;
  lVar2 = 0;
  do {
    rd_cost[lVar2] = 0x7fffffffffffffff;
    rd_cost[lVar2 + 1] = 0x7fffffffffffffff;
    lVar2 = lVar2 + 2;
  } while (lVar2 != 10);
  bVar7 = true;
  lVar2 = 0;
  local_bc = rate_overhead;
  best_rd_local = best_rd;
  local_a8 = cpi;
  local_a0 = rate;
  do {
    local_90 = (ulong)((byte)~bVar7 & 1) * 2 + 3;
    local_98 = lVar2 * 2;
    uVar6 = 0;
    bVar4 = true;
    while( true ) {
      iVar5 = (best_rd_local >> ((byte)local_90 & 0x3f)) + best_rd_local;
      if (best_rd_local == 0x7fffffffffffffff) {
        iVar5 = 0x7fffffffffffffff;
      }
      local_b0->angle_delta[1] = ((char)uVar6 * -2 + '\x01') * (char)lVar2;
      iVar5 = pick_intra_angle_routine_sbuv
                        (local_a8,x,bsize,local_bc,iVar5,local_a0,rd_stats,&best_angle_delta,
                         &best_rd_local);
      rd_cost[uVar6 | local_98] = iVar5;
      if (bVar7) break;
      uVar6 = 1;
      bVar1 = !bVar4;
      bVar4 = false;
      if (bVar1) {
        uVar6 = 1;
        do {
          uVar3 = 0;
          bVar7 = true;
          do {
            bVar4 = bVar7;
            lVar2 = (best_rd_local >> 5) + best_rd_local;
            if ((rd_cost[uVar3 | uVar6 * 2 + 2] <= lVar2) ||
               (rd_cost[uVar3 | uVar6 * 2 - 2] <= lVar2)) {
              local_b0->angle_delta[1] = (char)uVar6 * ((char)uVar3 * -2 + '\x01');
              pick_intra_angle_routine_sbuv
                        (local_a8,x,bsize,local_bc,best_rd_local,local_a0,rd_stats,&best_angle_delta
                         ,&best_rd_local);
            }
            uVar3 = 1;
            bVar7 = false;
          } while (bVar4);
          bVar7 = uVar6 < 2;
          uVar6 = uVar6 + 2;
        } while (bVar7);
        local_b0->angle_delta[1] = (int8_t)best_angle_delta;
        return (uint)(rd_stats->rate != 0x7fffffff);
      }
    }
    if (iVar5 == 0x7fffffffffffffff) {
      return 0;
    }
    lVar2 = 2;
    bVar7 = false;
    rd_cost[1] = iVar5;
  } while( true );
}

Assistant:

static int rd_pick_intra_angle_sbuv(const AV1_COMP *const cpi, MACROBLOCK *x,
                                    BLOCK_SIZE bsize, int rate_overhead,
                                    int64_t best_rd, int *rate,
                                    RD_STATS *rd_stats) {
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *mbmi = xd->mi[0];
  assert(!is_inter_block(mbmi));
  int i, angle_delta, best_angle_delta = 0;
  int64_t this_rd, best_rd_in, rd_cost[2 * (MAX_ANGLE_DELTA + 2)];

  rd_stats->rate = INT_MAX;
  rd_stats->skip_txfm = 0;
  rd_stats->dist = INT64_MAX;
  for (i = 0; i < 2 * (MAX_ANGLE_DELTA + 2); ++i) rd_cost[i] = INT64_MAX;

  for (angle_delta = 0; angle_delta <= MAX_ANGLE_DELTA; angle_delta += 2) {
    for (i = 0; i < 2; ++i) {
      best_rd_in = (best_rd == INT64_MAX)
                       ? INT64_MAX
                       : (best_rd + (best_rd >> ((angle_delta == 0) ? 3 : 5)));
      mbmi->angle_delta[PLANE_TYPE_UV] = (1 - 2 * i) * angle_delta;
      this_rd = pick_intra_angle_routine_sbuv(cpi, x, bsize, rate_overhead,
                                              best_rd_in, rate, rd_stats,
                                              &best_angle_delta, &best_rd);
      rd_cost[2 * angle_delta + i] = this_rd;
      if (angle_delta == 0) {
        if (this_rd == INT64_MAX) return 0;
        rd_cost[1] = this_rd;
        break;
      }
    }
  }

  assert(best_rd != INT64_MAX);
  for (angle_delta = 1; angle_delta <= MAX_ANGLE_DELTA; angle_delta += 2) {
    int64_t rd_thresh;
    for (i = 0; i < 2; ++i) {
      int skip_search = 0;
      rd_thresh = best_rd + (best_rd >> 5);
      if (rd_cost[2 * (angle_delta + 1) + i] > rd_thresh &&
          rd_cost[2 * (angle_delta - 1) + i] > rd_thresh)
        skip_search = 1;
      if (!skip_search) {
        mbmi->angle_delta[PLANE_TYPE_UV] = (1 - 2 * i) * angle_delta;
        pick_intra_angle_routine_sbuv(cpi, x, bsize, rate_overhead, best_rd,
                                      rate, rd_stats, &best_angle_delta,
                                      &best_rd);
      }
    }
  }

  mbmi->angle_delta[PLANE_TYPE_UV] = best_angle_delta;
  return rd_stats->rate != INT_MAX;
}